

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfirst.cpp
# Opt level: O0

intptr_t findfirst_dotdot(char *filespec,_finddata_t *fileinfo)

{
  int iVar1;
  char *__path;
  char *__s;
  int *piVar2;
  size_t sVar3;
  char *in_RDI;
  stat st;
  char *canonicalized;
  char *dirname;
  char *in_stack_ffffffffffffff48;
  stat *in_stack_ffffffffffffff50;
  intptr_t local_8;
  
  iVar1 = stat(in_RDI,(stat *)&stack0xffffffffffffff48);
  if (iVar1 == 0) {
    __path = realpath(in_RDI,(char *)0x0);
    if (__path == (char *)0x0) {
      findfirst_set_errno();
      local_8 = -1;
    }
    else {
      __s = __xpg_basename(__path);
      if (*__s == '\0') {
        free(__path);
        piVar2 = __errno_location();
        *piVar2 = 2;
        local_8 = -1;
      }
      else {
        sVar3 = strlen(__s);
        if (sVar3 < 0x104) {
          fill_finddata(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(_finddata_t *)0x258125)
          ;
          free(__path);
          local_8 = 0;
        }
        else {
          free(__path);
          piVar2 = __errno_location();
          *piVar2 = 0xc;
          local_8 = -1;
        }
      }
    }
  }
  else {
    findfirst_set_errno();
    local_8 = -1;
  }
  return local_8;
}

Assistant:

static intptr_t findfirst_dotdot(const char* filespec,
                                 struct _finddata_t* fileinfo) {
    char* dirname;
    char* canonicalized;
    struct stat st;

    if (stat(filespec, &st) != 0) {
        findfirst_set_errno();
        return INVALID_HANDLE;
    }

    /* Resolve filespec to an absolute path. */
    if ((canonicalized = realpath(filespec, NULL)) == NULL) {
        findfirst_set_errno();
        return INVALID_HANDLE;
    }

    /* Retrieve the basename from it. */
    dirname = basename(canonicalized);

    /* Make sure that we actually have a basename. */
    if (dirname[0] == '\0') {
        free(canonicalized);
        errno = ENOENT;
        return INVALID_HANDLE;
    }

    /* Make sure that we won't overflow finddata_t::name. */
    if (strlen(dirname) > 259) {
        free(canonicalized);
        errno = ENOMEM;
        return INVALID_HANDLE;
    }

    fill_finddata(&st, dirname, fileinfo);

    free(canonicalized);

    /*
     * Return a special handle since we can't return
     * NULL. The findnext and findclose functions know
     * about this custom handle.
     */
    return DOTDOT_HANDLE;
}